

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

ssize_t __thiscall chatter::Packet::read(Packet *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined7 extraout_var;
  uint64_t *puVar3;
  uint64_t uVar4;
  undefined4 in_register_00000034;
  uint64_t local_20;
  uint64_t *local_18;
  int64_t *data_local;
  Packet *this_local;
  Packet *pPVar2;
  
  local_18 = (uint64_t *)CONCAT44(in_register_00000034,__fd);
  data_local = (int64_t *)this;
  bVar1 = check_bounds(this,8);
  pPVar2 = (Packet *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    puVar3 = (uint64_t *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_data,this->m_read_pos);
    local_20 = *puVar3;
    uVar4 = platform::NetToHost64(&local_20);
    *local_18 = uVar4;
    this->m_read_pos = this->m_read_pos + 8;
    pPVar2 = this;
  }
  return (ssize_t)pPVar2;
}

Assistant:

void Packet::read(int64_t& data)
{
    if (!check_bounds(sizeof(data)))
        return;

    data = platform::NetToHost64(*reinterpret_cast<const int64_t*>(&m_data[m_read_pos]));
    m_read_pos += sizeof(data);
}